

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd_privkey.c
# Opt level: O0

err_t cmdPrivkeyWrite(octet *privkey,size_t privkey_len,char *name,cmd_pwd_t pwd)

{
  size_t *privkey_00;
  size_t in_RCX;
  octet *in_RDX;
  char *in_RSI;
  void *in_RDI;
  size_t epki_len;
  octet *epki;
  octet *salt;
  void *stack;
  size_t iter;
  err_t code;
  size_t size;
  size_t *count;
  size_t in_stack_ffffffffffffffa0;
  octet *in_stack_ffffffffffffffa8;
  size_t in_stack_ffffffffffffffb0;
  size_t *privkey_len_00;
  octet *in_stack_ffffffffffffffb8;
  size_t *in_stack_ffffffffffffffc0;
  size_t *epki_len_00;
  octet *epki_00;
  uint in_stack_ffffffffffffffd0;
  char *iter_00;
  err_t local_4;
  
  epki_00 = (octet *)0x2710;
  size = 0;
  local_4 = bpkiPrivkeyWrap((octet *)0x2710,in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,
                            in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,
                            in_stack_ffffffffffffffa0,in_RDX,(size_t)in_RSI);
  if (local_4 == 0) {
    privkey_00 = (size_t *)blobCreate(size);
    local_4 = 0x6e;
    if (privkey_00 != (size_t *)0x0) {
      local_4 = 0;
    }
    if (local_4 == 0) {
      count = privkey_00 + 1;
      epki_len_00 = privkey_00;
      local_4 = cmdRngStart((bool_t)in_RDI);
      if (local_4 == 0) {
        rngStepR((void *)(ulong)in_stack_ffffffffffffffd0,(size_t)epki_00,epki_len_00);
        privkey_len_00 = count;
        iter_00 = in_RSI;
        strLen((char *)0x106918);
        local_4 = bpkiPrivkeyWrap(epki_00,epki_len_00,(octet *)privkey_00,(size_t)privkey_len_00,
                                  in_stack_ffffffffffffffa8,in_RCX,in_RDX,(size_t)iter_00);
        if (local_4 == 0) {
          local_4 = cmdFileWrite(in_RSI,in_RDI,(size_t)count);
          blobClose((blob_t)0x10698c);
        }
        else {
          blobClose((blob_t)0x10695d);
        }
      }
      else {
        blobClose((blob_t)0x1068c3);
      }
    }
  }
  return local_4;
}

Assistant:

err_t cmdPrivkeyWrite(const octet privkey[], size_t privkey_len,
	const char* name, const cmd_pwd_t pwd)
{
	err_t code;
	const size_t iter = 10000;
	void* stack;
	octet* salt;
	octet* epki;
	size_t epki_len;
	// pre
	ASSERT(privkey_len == 24 || privkey_len == 32 || privkey_len == 48 || 
		privkey_len == 64);
	ASSERT(memIsValid(privkey, privkey_len));
	ASSERT(strIsValid(name));
	ASSERT(cmdPwdIsValid(pwd));
	// определить длину контейнера
	code = bpkiPrivkeyWrap(0, &epki_len, 0, privkey_len, 0, 0, 0, iter);
	ERR_CALL_CHECK(code);
	// выделить память и разметить ее
	code = cmdBlobCreate(stack, 8 + epki_len);
	ERR_CALL_CHECK(code);
	salt = (octet*)stack;
	epki = salt + 8;
	// запустить ГСЧ
	code = cmdRngStart(TRUE);
	ERR_CALL_HANDLE(code, cmdBlobClose(stack));
	// установить защиту
	rngStepR(salt, 8, 0);
	code = bpkiPrivkeyWrap(epki, 0, privkey, privkey_len, (const octet*)pwd,
		cmdPwdLen(pwd), salt, iter);
	ERR_CALL_HANDLE(code, cmdBlobClose(stack));
	// записать в файл
	code = cmdFileWrite(name, epki, epki_len);
	// завершить
	cmdBlobClose(stack);
	return code;
}